

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O0

void cdef_init_fb_col(MACROBLOCKD *xd,CdefBlockInfo *fb_info,int *level,int *sec_strength,int fbc,
                     int fbr,int plane)

{
  byte bVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  PLANE_TYPE plane_type;
  
  bVar1 = get_plane_type(in_stack_00000008);
  *(undefined4 *)(in_RSI + 0x268) = *(undefined4 *)(in_RDX + (ulong)bVar1 * 4);
  *(undefined4 *)(in_RSI + 0x26c) = *(undefined4 *)(in_RCX + (ulong)bVar1 * 4);
  *(undefined8 *)(in_RSI + 0x38) = *(undefined8 *)(in_RDI + (long)in_stack_00000008 * 0xa30 + 0x20);
  *(undefined4 *)(in_RSI + 0xa74) = *(undefined4 *)(in_RDI + (long)in_stack_00000008 * 0xa30 + 0x38)
  ;
  *(undefined4 *)(in_RSI + 0x240) = *(undefined4 *)(in_RDI + (long)in_stack_00000008 * 0xa30 + 0x14)
  ;
  *(undefined4 *)(in_RSI + 0x244) = *(undefined4 *)(in_RDI + (long)in_stack_00000008 * 0xa30 + 0x18)
  ;
  *(int *)(in_RSI + 0x248) = 2 - *(int *)(in_RDI + (long)in_stack_00000008 * 0xa30 + 0x14);
  *(int *)(in_RSI + 0x24c) = 2 - *(int *)(in_RDI + (long)in_stack_00000008 * 0xa30 + 0x18);
  *(int *)(in_RSI + 0xa7c) = (in_R9D << 4) << ((byte)*(undefined4 *)(in_RSI + 0x24c) & 0x1f);
  *(int *)(in_RSI + 0xa78) = (in_R8D << 4) << ((byte)*(undefined4 *)(in_RSI + 0x248) & 0x1f);
  return;
}

Assistant:

static inline void cdef_init_fb_col(const MACROBLOCKD *const xd,
                                    CdefBlockInfo *const fb_info, int *level,
                                    int *sec_strength, int fbc, int fbr,
                                    int plane) {
  const PLANE_TYPE plane_type = get_plane_type(plane);
  fb_info->level = level[plane_type];
  fb_info->sec_strength = sec_strength[plane_type];
  fb_info->dst = xd->plane[plane].dst.buf;
  fb_info->dst_stride = xd->plane[plane].dst.stride;

  fb_info->xdec = xd->plane[plane].subsampling_x;
  fb_info->ydec = xd->plane[plane].subsampling_y;
  fb_info->mi_wide_l2 = MI_SIZE_LOG2 - xd->plane[plane].subsampling_x;
  fb_info->mi_high_l2 = MI_SIZE_LOG2 - xd->plane[plane].subsampling_y;
  fb_info->roffset = MI_SIZE_64X64 * fbr << fb_info->mi_high_l2;
  fb_info->coffset = MI_SIZE_64X64 * fbc << fb_info->mi_wide_l2;
}